

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

LoadFileStatus lf_load_fp(LoadedFile *lf,FILE *fp)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  LoadFileStatus LVar4;
  int iVar5;
  size_t sVar6;
  
  lf->len = 0;
  do {
    uVar1 = lf->len;
    sVar6 = lf->max_size - uVar1;
    if (lf->max_size < uVar1 || sVar6 == 0) goto LAB_00127b3b;
    sVar6 = fread(lf->data + uVar1,1,sVar6,(FILE *)fp);
    iVar3 = ferror((FILE *)fp);
    iVar5 = 1;
    if (iVar3 == 0) {
      if (sVar6 == 0) {
        iVar5 = 3;
      }
      else {
        lf->len = lf->len + sVar6;
        iVar5 = 0;
      }
    }
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    LVar4 = LF_ERROR;
  }
  else {
LAB_00127b3b:
    LVar4 = LF_OK;
    if (lf->len == lf->max_size) {
      iVar3 = fgetc((FILE *)fp);
      LVar4 = (LoadFileStatus)(iVar3 != -1);
    }
    sVar2 = lf->len;
    lf->binarysource_[0].data = lf->data;
    lf->binarysource_[0].len = sVar2;
    lf->binarysource_[0].pos = 0;
    lf->binarysource_[0].err = BSE_NO_ERROR;
    lf->binarysource_[0].binarysource_ = lf->binarysource_;
  }
  return LVar4;
}

Assistant:

LoadFileStatus lf_load_fp(LoadedFile *lf, FILE *fp)
{
    lf->len = 0;
    while (lf->len < lf->max_size) {
        size_t retd = fread(lf->data + lf->len, 1, lf->max_size - lf->len, fp);
        if (ferror(fp))
            return LF_ERROR;

        if (retd == 0)
            break;

        lf->len += retd;
    }

    LoadFileStatus status = LF_OK;

    if (lf->len == lf->max_size) {
        /* The file might be too long to fit in our fixed-size
         * structure. Try reading one more byte, to check. */
        if (fgetc(fp) != EOF)
            status = LF_TOO_BIG;
    }

    BinarySource_INIT(lf, lf->data, lf->len);

    return status;
}